

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_logger.h
# Opt level: O0

void __thiscall leveldb::PosixLogger::Logv(PosixLogger *this,char *format,__va_list_tag *arguments)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined4 uVar7;
  int iVar8;
  size_type sVar9;
  char *pcVar10;
  undefined8 *in_RDX;
  char *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int buffer_offset;
  char *buffer;
  int buffer_size;
  int iteration;
  int dynamic_buffer_size;
  int kStackBufferSize;
  int kMaxThreadIdSize;
  tm now_components;
  time_t now_seconds;
  timeval now_timeval;
  va_list arguments_copy;
  char stack_buffer [512];
  string thread_id;
  ostringstream thread_stream;
  int in_stack_fffffffffffffad8;
  undefined4 in_stack_fffffffffffffadc;
  id in_stack_fffffffffffffaf8;
  char *local_4b0;
  int local_4a4;
  int local_490;
  int local_464;
  tm local_428;
  __time_t local_3f0;
  timeval local_3e8;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  char local_3b8 [552];
  ostringstream local_190 [376];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  gettimeofday(&local_3e8,(__timezone_ptr_t)0x0);
  local_3f0 = local_3e8.tv_sec;
  localtime_r(&local_3f0,&local_428);
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::this_thread::get_id();
  std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                  CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                  in_stack_fffffffffffffaf8);
  std::__cxx11::ostringstream::str();
  sVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
  if (0x20 < sVar9) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),0x18d474c);
  }
  local_464 = 0;
  bVar1 = false;
  do {
    if (true < bVar1) {
LAB_018d4b39:
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
      std::__cxx11::ostringstream::~ostringstream(local_190);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        return;
      }
      __stack_chk_fail();
    }
    if (bVar1) {
      local_4b0 = (char *)operator_new__((long)local_464);
      iVar8 = in_stack_fffffffffffffad8;
      local_4a4 = local_464;
    }
    else {
      local_4a4 = 0x200;
      local_4b0 = local_3b8;
      iVar8 = in_stack_fffffffffffffad8;
    }
    iVar4 = local_428.tm_mday;
    in_stack_fffffffffffffad8 = local_428.tm_hour;
    iVar3 = local_428.tm_min;
    iVar2 = local_428.tm_sec;
    uVar5 = local_428.tm_year + 0x76c;
    uVar6 = local_428.tm_mon + 1;
    uVar7 = (undefined4)local_3e8.tv_usec;
    pcVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffadc,iVar8));
    iVar8 = snprintf(local_4b0,(long)local_4a4,"%04d/%02d/%02d-%02d:%02d:%02d.%06d %s ",(ulong)uVar5
                     ,(ulong)uVar6,(ulong)(uint)iVar4,in_stack_fffffffffffffad8,iVar3,iVar2,uVar7,
                     pcVar10);
    if (0x3c < iVar8) {
      __assert_fail("buffer_offset <= 28 + kMaxThreadIdSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/posix_logger.h"
                    ,0x4b,"virtual void leveldb::PosixLogger::Logv(const char *, __va_list_tag *)");
    }
    if (local_4a4 <= iVar8) {
      __assert_fail("buffer_offset < buffer_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/posix_logger.h"
                    ,0x4e,"virtual void leveldb::PosixLogger::Logv(const char *, __va_list_tag *)");
    }
    local_3c8 = in_RDX[2];
    local_3d8 = *in_RDX;
    uStack_3d0 = in_RDX[1];
    local_490 = vsnprintf(local_4b0 + iVar8,(long)(local_4a4 - iVar8),in_RSI,&local_3d8);
    local_490 = local_490 + iVar8;
    if (local_490 < local_4a4 + -1) {
      if (local_4b0[local_490 + -1] != '\n') {
        local_4b0[local_490] = '\n';
        local_490 = local_490 + 1;
      }
      if (local_4a4 < local_490) {
        __assert_fail("buffer_offset <= buffer_size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/posix_logger.h"
                      ,0x71,"virtual void leveldb::PosixLogger::Logv(const char *, __va_list_tag *)"
                     );
      }
      fwrite(local_4b0,1,(long)local_490,*(FILE **)(in_RDI + 8));
      fflush(*(FILE **)(in_RDI + 8));
      if ((bVar1) && (local_4b0 != (char *)0x0)) {
        operator_delete__(local_4b0);
      }
      goto LAB_018d4b39;
    }
    if (bVar1) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/posix_logger.h"
                    ,0x67,"virtual void leveldb::PosixLogger::Logv(const char *, __va_list_tag *)");
    }
    local_464 = local_490 + 2;
    bVar1 = true;
  } while( true );
}

Assistant:

void Logv(const char* format, va_list arguments) override {
    // Record the time as close to the Logv() call as possible.
    struct ::timeval now_timeval;
    ::gettimeofday(&now_timeval, nullptr);
    const std::time_t now_seconds = now_timeval.tv_sec;
    struct std::tm now_components;
    ::localtime_r(&now_seconds, &now_components);

    // Record the thread ID.
    constexpr const int kMaxThreadIdSize = 32;
    std::ostringstream thread_stream;
    thread_stream << std::this_thread::get_id();
    std::string thread_id = thread_stream.str();
    if (thread_id.size() > kMaxThreadIdSize) {
      thread_id.resize(kMaxThreadIdSize);
    }

    // We first attempt to print into a stack-allocated buffer. If this attempt
    // fails, we make a second attempt with a dynamically allocated buffer.
    constexpr const int kStackBufferSize = 512;
    char stack_buffer[kStackBufferSize];
    static_assert(sizeof(stack_buffer) == static_cast<size_t>(kStackBufferSize),
                  "sizeof(char) is expected to be 1 in C++");

    int dynamic_buffer_size = 0;  // Computed in the first iteration.
    for (int iteration = 0; iteration < 2; ++iteration) {
      const int buffer_size =
          (iteration == 0) ? kStackBufferSize : dynamic_buffer_size;
      char* const buffer =
          (iteration == 0) ? stack_buffer : new char[dynamic_buffer_size];

      // Print the header into the buffer.
      int buffer_offset = snprintf(
          buffer, buffer_size, "%04d/%02d/%02d-%02d:%02d:%02d.%06d %s ",
          now_components.tm_year + 1900, now_components.tm_mon + 1,
          now_components.tm_mday, now_components.tm_hour, now_components.tm_min,
          now_components.tm_sec, static_cast<int>(now_timeval.tv_usec),
          thread_id.c_str());

      // The header can be at most 28 characters (10 date + 15 time +
      // 3 delimiters) plus the thread ID, which should fit comfortably into the
      // static buffer.
      assert(buffer_offset <= 28 + kMaxThreadIdSize);
      static_assert(28 + kMaxThreadIdSize < kStackBufferSize,
                    "stack-allocated buffer may not fit the message header");
      assert(buffer_offset < buffer_size);

      // Print the message into the buffer.
      std::va_list arguments_copy;
      va_copy(arguments_copy, arguments);
      buffer_offset +=
          std::vsnprintf(buffer + buffer_offset, buffer_size - buffer_offset,
                         format, arguments_copy);
      va_end(arguments_copy);

      // The code below may append a newline at the end of the buffer, which
      // requires an extra character.
      if (buffer_offset >= buffer_size - 1) {
        // The message did not fit into the buffer.
        if (iteration == 0) {
          // Re-run the loop and use a dynamically-allocated buffer. The buffer
          // will be large enough for the log message, an extra newline and a
          // null terminator.
          dynamic_buffer_size = buffer_offset + 2;
          continue;
        }

        // The dynamically-allocated buffer was incorrectly sized. This should
        // not happen, assuming a correct implementation of (v)snprintf. Fail
        // in tests, recover by truncating the log message in production.
        assert(false);
        buffer_offset = buffer_size - 1;
      }

      // Add a newline if necessary.
      if (buffer[buffer_offset - 1] != '\n') {
        buffer[buffer_offset] = '\n';
        ++buffer_offset;
      }

      assert(buffer_offset <= buffer_size);
      std::fwrite(buffer, 1, buffer_offset, fp_);
      std::fflush(fp_);

      if (iteration != 0) {
        delete[] buffer;
      }
      break;
    }
  }